

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O1

size_t __thiscall cali::Entry::pack(Entry *this,uchar *buffer)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  uchar *puVar6;
  size_t sVar7;
  long lVar8;
  
  uVar4 = this->m_node->m_id;
  sVar7 = 1;
  puVar6 = buffer;
  if (0x7f < uVar4) {
    uVar3 = uVar4;
    lVar2 = 0;
    do {
      lVar8 = lVar2;
      buffer[lVar8] = (byte)uVar3 | 0x80;
      uVar4 = uVar3 >> 7;
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar4;
      lVar2 = lVar8 + 1;
    } while (bVar1);
    sVar7 = lVar8 + 2;
    puVar6 = buffer + lVar8 + 1;
  }
  *puVar6 = (uchar)uVar4;
  if (this->m_node->m_attribute == 8) {
    sVar5 = cali_variant_pack((this->m_value).m_v,buffer + sVar7);
    sVar7 = sVar7 + sVar5;
  }
  return sVar7;
}

Assistant:

size_t Entry::pack(unsigned char* buffer) const
{
    size_t pos = 0;
    pos += vlenc_u64(m_node->id(), buffer);
    if (m_node->attribute() == Attribute::NAME_ATTR_ID)
        pos += m_value.pack(buffer + pos);
    return pos;
}